

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O3

void __thiscall
CMU462::Timeline::drawCircle(Timeline *this,double cx,double cy,double r,int num_segments)

{
  int iVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  
  glBegin(2);
  if (0 < num_segments) {
    iVar1 = 0;
    do {
      fVar3 = ((float)iVar1 * 6.283185) / (float)num_segments;
      fVar2 = cosf(fVar3);
      fVar3 = sinf(fVar3);
      dVar4 = (double)fVar2 * r + cx;
      dVar5 = (double)fVar3 * r + cy;
      glVertex2f(CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4),
                 CONCAT44((int)((ulong)dVar5 >> 0x20),(float)dVar5));
      iVar1 = iVar1 + 1;
    } while (num_segments != iVar1);
  }
  glEnd();
  return;
}

Assistant:

void Timeline::drawCircle(double cx, double cy, double r, int num_segments)
  {
    glBegin(GL_LINE_LOOP);
    for (int i = 0; i < num_segments; i++)
	{
	  // Current Angle.
	  double theta = 2.0 * 3.1415926 * float(i) / float(num_segments);
	  double dx = r * cosf(theta);
	  double dy = r * sinf(theta);
	  glVertex2f(cx + dx, cy + dy);
    }
    glEnd();
  }